

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_get_channel_binding(Curl_easy *data,int sockindex,dynbuf *binding)

{
  long lVar1;
  int iVar2;
  CURLcode CVar3;
  X509 *data_00;
  EVP_MD *type;
  char *pcVar4;
  char *pcVar5;
  Curl_cfilter *pCVar6;
  int algo_nid;
  uint length;
  char prefix [22];
  uchar buf [64];
  
  builtin_strncpy(prefix,"tls-server-end-point:",0x16);
  pCVar6 = data->conn->cfilter[sockindex];
  do {
    pcVar5 = pCVar6->cft->name;
    if ((pcVar5 != (char *)0x0) && (iVar2 = strcmp(pcVar5,"SSL"), iVar2 == 0)) {
      lVar1 = *(long *)((long)pCVar6->ctx + 0x40);
      if (lVar1 != 0) {
        data_00 = (X509 *)SSL_get1_peer_certificate(*(undefined8 *)(lVar1 + 8));
        if (data_00 == (X509 *)0x0) {
          return CURLE_OK;
        }
        iVar2 = X509_get_signature_nid(data_00);
        iVar2 = OBJ_find_sigid_algs(iVar2,&algo_nid,(int *)0x0);
        if (iVar2 == 0) {
          pcVar5 = "Unable to find digest NID for certificate signature algorithm";
        }
        else {
          if ((algo_nid == 0x40) || (algo_nid == 4)) {
            type = EVP_sha256();
          }
          else {
            pcVar5 = OBJ_nid2sn(algo_nid);
            type = EVP_get_digestbyname(pcVar5);
            if (type == (EVP_MD *)0x0) {
              pcVar4 = OBJ_nid2sn(algo_nid);
              pcVar5 = "(null)";
              if (pcVar4 != (char *)0x0) {
                pcVar5 = pcVar4;
              }
              Curl_failf(data,"Could not find digest algorithm %s (NID %d)",pcVar5,
                         (ulong)(uint)algo_nid);
              return CURLE_SSL_INVALIDCERTSTATUS;
            }
          }
          iVar2 = X509_digest(data_00,type,buf,&length);
          if (iVar2 != 0) {
            CVar3 = Curl_dyn_addn(binding,prefix,0x15);
            if (CVar3 != CURLE_OK) {
              return CURLE_OUT_OF_MEMORY;
            }
            CVar3 = Curl_dyn_addn(binding,buf,(ulong)length);
            if (CVar3 == CURLE_OK) {
              return CURLE_OK;
            }
            return CURLE_OUT_OF_MEMORY;
          }
          pcVar5 = "X509_digest() failed";
        }
        Curl_failf(data,pcVar5);
        return CURLE_SSL_INVALIDCERTSTATUS;
      }
      break;
    }
    if (pCVar6->next != (Curl_cfilter *)0x0) {
      pCVar6 = pCVar6->next;
    }
  } while (pCVar6->next != (Curl_cfilter *)0x0);
  Curl_failf(data,"Failed to find the SSL filter");
  return CURLE_BAD_FUNCTION_ARGUMENT;
}

Assistant:

static CURLcode ossl_get_channel_binding(struct Curl_easy *data, int sockindex,
                                         struct dynbuf *binding)
{
  /* required for X509_get_signature_nid support */
#if OPENSSL_VERSION_NUMBER > 0x10100000L
  X509 *cert;
  int algo_nid;
  const EVP_MD *algo_type;
  const char *algo_name;
  unsigned int length;
  unsigned char buf[EVP_MAX_MD_SIZE];

  const char prefix[] = "tls-server-end-point:";
  struct connectdata *conn = data->conn;
  struct Curl_cfilter *cf = conn->cfilter[sockindex];
  struct ossl_ctx *octx = NULL;

  do {
    const struct Curl_cftype *cft = cf->cft;
    struct ssl_connect_data *connssl = cf->ctx;

    if(cft->name && !strcmp(cft->name, "SSL")) {
      octx = (struct ossl_ctx *)connssl->backend;
      break;
    }

    if(cf->next)
      cf = cf->next;

  } while(cf->next);

  if(!octx) {
    failf(data, "Failed to find the SSL filter");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  cert = SSL_get1_peer_certificate(octx->ssl);
  if(!cert) {
    /* No server certificate, don't do channel binding */
    return CURLE_OK;
  }

  if(!OBJ_find_sigid_algs(X509_get_signature_nid(cert), &algo_nid, NULL)) {
    failf(data,
          "Unable to find digest NID for certificate signature algorithm");
    return CURLE_SSL_INVALIDCERTSTATUS;
  }

  /* https://datatracker.ietf.org/doc/html/rfc5929#section-4.1 */
  if(algo_nid == NID_md5 || algo_nid == NID_sha1) {
    algo_type = EVP_sha256();
  }
  else {
    algo_type = EVP_get_digestbynid(algo_nid);
    if(!algo_type) {
      algo_name = OBJ_nid2sn(algo_nid);
      failf(data, "Could not find digest algorithm %s (NID %d)",
            algo_name ? algo_name : "(null)", algo_nid);
      return CURLE_SSL_INVALIDCERTSTATUS;
    }
  }

  if(!X509_digest(cert, algo_type, buf, &length)) {
    failf(data, "X509_digest() failed");
    return CURLE_SSL_INVALIDCERTSTATUS;
  }

  /* Append "tls-server-end-point:" */
  if(Curl_dyn_addn(binding, prefix, sizeof(prefix) - 1) != CURLE_OK)
    return CURLE_OUT_OF_MEMORY;
  /* Append digest */
  if(Curl_dyn_addn(binding, buf, length))
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
#else
  /* No X509_get_signature_nid support */
  (void)data; /* unused */
  (void)sockindex; /* unused */
  (void)binding; /* unused */
  return CURLE_OK;
#endif
}